

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O2

primitive_dictionary_entry_t * __thiscall
duckdb::PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>::Lookup
          (PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator> *this
          ,double_na_equal *value)

{
  primitive_dictionary_entry_t *ppVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  
  uVar4 = Hash<duckdb::double_na_equal>(*(undefined8 *)value);
  dVar2 = *(double *)value;
  while( true ) {
    uVar4 = uVar4 & this->capacity_mask;
    ppVar1 = this->dictionary + uVar4;
    if (this->dictionary[uVar4].index == 0xffffffff) {
      return ppVar1;
    }
    dVar3 = *(double *)ppVar1;
    if (NAN(dVar3) && NAN(dVar2)) break;
    uVar4 = uVar4 + 1;
    if ((dVar3 == dVar2) && (!NAN(dVar3) && !NAN(dVar2))) {
      return ppVar1;
    }
  }
  return ppVar1;
}

Assistant:

primitive_dictionary_entry_t &Lookup(const SRC &value) const {
		auto offset = Hash(value) & capacity_mask;
		while (!dictionary[offset].IsEmpty() && dictionary[offset].value != value) {
			++offset &= capacity_mask;
		}
		return dictionary[offset];
	}